

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O2

size_t __thiscall
backward::StackTraceImpl<backward::system_tag::linux_tag>::load_from
          (StackTraceImpl<backward::system_tag::linux_tag> *this,void *addr,size_t depth,
          void *context,void *error_addr)

{
  size_t *psVar1;
  pointer ppvVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  ulong __new_size;
  
  load_here(this,depth + 8,context,error_addr);
  ppvVar2 = (this->super_StackTraceImplHolder)._stacktrace.
            super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
            _M_start;
  uVar3 = (long)(this->super_StackTraceImplHolder)._stacktrace.
                super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
                _M_finish - (long)ppvVar2 >> 3;
  uVar5 = 0;
  do {
    if (uVar3 == uVar5) {
      uVar5 = (this->super_StackTraceImplHolder).super_StackTraceImplBase._skip;
LAB_0010b348:
      __new_size = uVar5 + depth;
      if (uVar3 <= uVar5 + depth) {
        __new_size = uVar3;
      }
      std::vector<void_*,_std::allocator<void_*>_>::resize
                (&(this->super_StackTraceImplHolder)._stacktrace,__new_size);
      uVar5 = (long)(this->super_StackTraceImplHolder)._stacktrace.
                    super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->super_StackTraceImplHolder)._stacktrace.
                    super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3;
      psVar1 = &(this->super_StackTraceImplHolder).super_StackTraceImplBase._skip;
      sVar4 = 0;
      if (*psVar1 <= uVar5) {
        sVar4 = uVar5 - *psVar1;
      }
      return sVar4;
    }
    if (ppvVar2[uVar5] == addr) {
      (this->super_StackTraceImplHolder).super_StackTraceImplBase._skip = uVar5;
      goto LAB_0010b348;
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

size_t load_from(void *addr, size_t depth = 32, void *context = nullptr,
                   void *error_addr = nullptr) {
    load_here(depth + 8, context, error_addr);

    for (size_t i = 0; i < _stacktrace.size(); ++i) {
      if (_stacktrace[i] == addr) {
        skip_n_firsts(i);
        break;
      }
    }

    _stacktrace.resize(std::min(_stacktrace.size(), skip_n_firsts() + depth));
    return size();
  }